

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O1

VectorType * __thiscall
LLVMBC::LLVMContext::construct<LLVMBC::VectorType,LLVMBC::LLVMContext&,unsigned_int&,LLVMBC::Type*&>
          (LLVMContext *this,LLVMContext *u,uint *u_1,Type **u_2)

{
  uint uVar1;
  Type *pTVar2;
  VectorType *pVVar3;
  
  pVVar3 = (VectorType *)allocate(this,0x20,8);
  if (pVVar3 != (VectorType *)0x0) {
    uVar1 = *u_1;
    pTVar2 = *u_2;
    (pVVar3->super_Type).context = u;
    (pVVar3->super_Type).type_id = VectorTyID;
    (pVVar3->super_Type).address_space = 0;
    pVVar3->element_type = pTVar2;
    pVVar3->vector_size = uVar1;
    return pVVar3;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}